

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O2

void __thiscall host_array_front_Test::host_array_front_Test(host_array_front_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0014adb0;
  return;
}

Assistant:

CAMP_TEST_BEGIN(array, back)
{
   camp::array<int, 2> a = {1, 8};

   bool passed = a[0] == 1 &&
                 a[1] == 8 &&
                 a.back() == 8;

   a.back() = 3;

   return passed &&
          a[0] == 1 &&
          a[1] == 3 &&
          a.back() == 3;
}